

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<unsigned_long>,duckdb::HistogramBinFunction>
               (HistogramBinState<unsigned_long> *source,HistogramBinState<unsigned_long> *target,
               AggregateInputData *input_data)

{
  unsafe_vector<unsigned_long> *puVar1;
  unsafe_vector<unsigned_long> *puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  unsafe_vector<idx_t> *puVar7;
  NotImplementedException *this_00;
  InternalException *this_01;
  long lVar8;
  size_t __n;
  long lVar9;
  string local_48;
  
  puVar1 = source->bin_boundaries;
  if (puVar1 != (unsafe_vector<unsigned_long> *)0x0) {
    puVar2 = target->bin_boundaries;
    if (puVar2 == (unsafe_vector<unsigned_long> *)0x0) {
      this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x18);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 *)(this + 0x10) = 0;
      target->bin_boundaries = (unsafe_vector<unsigned_long> *)this;
      puVar7 = (unsafe_vector<idx_t> *)operator_new(0x18);
      (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      target->counts = puVar7;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (this,&source->bin_boundaries->
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)target->counts,
                 &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    puVar3 = (puVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (puVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar4 - (long)puVar3;
    puVar5 = (puVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (__n != (long)(puVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar5) {
LAB_019a2da1:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
                 ,"");
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (puVar4 != puVar3) {
      iVar6 = bcmp(puVar3,puVar5,__n);
      if (iVar6 != 0) goto LAB_019a2da1;
    }
    puVar3 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)puVar4 - (long)puVar3;
    puVar5 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (lVar8 != (long)(source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Histogram combine - bin boundaries are the same but counts are different","");
      InternalException::InternalException(this_01,&local_48);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (puVar4 != puVar3) {
      lVar8 = lVar8 >> 3;
      lVar9 = 0;
      do {
        puVar3[lVar9] = puVar3[lVar9] + puVar5[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}